

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableIntTest_NopointerSerialization_Test<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableIntTest_NopointerSerialization_Test<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  undefined8 *puVar1;
  const_iterator cVar2;
  bool bVar3;
  int iVar4;
  FILE *__stream;
  ulong uVar5;
  int i;
  int index;
  char *pcVar6;
  SetKey *pSVar7;
  bool bVar8;
  float fVar9;
  pair<unsigned_long,_unsigned_long> pVar10;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_;
  TypeParam ht_in;
  TypeParam ht_out;
  TransparentHasher local_1e0;
  undefined1 local_1d0 [8];
  undefined8 *local_1c8;
  AssertHelper local_1c0;
  SetKey local_1b1;
  const_iterator local_1b0;
  undefined1 *local_168;
  undefined1 local_160 [16];
  undefined1 local_150 [28];
  float local_134;
  undefined1 local_130;
  undefined8 local_118;
  sparsetable<int,(unsigned_short)48,Alloc<int,unsigned_long,18446744073709551615ul>> local_110 [56]
  ;
  int *local_d8;
  undefined **local_c8;
  undefined1 local_c0 [144];
  
  local_1b0.ht = (sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)0x0;
  local_1b0.pos.row_begin._M_current = local_1b0.pos.row_begin._M_current & 0xffffffff00000000;
  local_1d0 = (undefined1  [8])0x0;
  local_1c8 = (undefined8 *)((ulong)local_1c8 & 0xffffffff00000000);
  local_160._0_8_ = local_160._0_8_ & 0xffffffff00000000;
  local_160._8_8_ =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  local_c8 = &PTR__BaseHashtableInterface_00c23ca8;
  pSVar7 = (SetKey *)&local_1c0;
  google::
  sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable((sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)local_c0,0,(TransparentHasher *)&local_1b0,(TransparentHasher *)local_1d0,
                     (Identity *)&local_1e0,pSVar7,
                     (Alloc<int,_unsigned_long,_18446744073709551615UL> *)local_160);
  local_c8 = &PTR__BaseHashtableInterface_00c23c28;
  iVar4 = UniqueObjectHelper<int>(2000);
  google::
  sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)local_c0);
  local_c0[0x2a] = true;
  index = 1;
  local_c0._60_4_ = iVar4;
  do {
    iVar4 = UniqueObjectHelper<int>(index);
    local_1b0.ht = (sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)CONCAT44(local_1b0.ht._4_4_,iVar4);
    google::
    sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::insert((pair<google::sparse_hashtable_const_iterator<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
              *)local_160,
             (sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)local_c0,(value_type *)&local_1b0);
    index = index + 1;
  } while (index != 100);
  iVar4 = UniqueObjectHelper<int>(0x38);
  local_160._0_4_ = iVar4;
  google::
  sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase((sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)local_c0,(key_type *)local_160);
  local_160._0_4_ = UniqueObjectHelper<int>(0x16);
  google::
  sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase((sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)local_c0,(key_type *)local_160);
  __stream = tmpfile();
  bVar8 = __stream != (FILE *)0x0;
  local_1b0.ht = (sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT71(local_1b0.ht._1_7_,bVar8);
  local_1b0.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  if (!bVar8) {
    testing::Message::Message((Message *)local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_160,(internal *)&local_1b0,(AssertionResult *)"fp != __null","false",
               "true",(char *)pSVar7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4d6,(char *)local_160._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e0,(Message *)local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e0);
    if ((sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_160._0_8_ !=
        (sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_150) {
      operator_delete((void *)local_160._0_8_);
    }
    if (local_1d0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1d0 + 8))();
    }
  }
  cVar2._M_current = local_1b0.pos.row_begin._M_current;
  if (local_1b0.pos.row_begin._M_current !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)(local_1b0.pos.row_begin._M_current)->group !=
        &((local_1b0.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_1b0.pos.row_begin._M_current)->group);
    }
    operator_delete(cVar2._M_current);
  }
  google::
  sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)local_c0);
  bVar3 = google::
          sparsetable<int,(unsigned_short)48,Alloc<int,unsigned_long,18446744073709551615ul>>::
          serialize<google::sparsehash_internal::pod_serializer<int>,_IO_FILE>
                    ((sparsetable<int,(unsigned_short)48,Alloc<int,unsigned_long,18446744073709551615ul>>
                      *)(local_c0 + 0x48));
  local_1b0.ht = (sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT71(local_1b0.ht._1_7_,bVar3);
  local_1b0.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_160,(internal *)&local_1b0,
               (AssertionResult *)"ht_out.serialize(typename TypeParam::NopointerSerializer(), fp)",
               "false","true",(char *)pSVar7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4d7,(char *)local_160._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e0,(Message *)local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e0);
    if ((sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_160._0_8_ !=
        (sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)local_150) {
      operator_delete((void *)local_160._0_8_);
    }
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_1d0 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d0 + 8))();
    }
  }
  cVar2._M_current = local_1b0.pos.row_begin._M_current;
  if (local_1b0.pos.row_begin._M_current !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)(local_1b0.pos.row_begin._M_current)->group !=
        &((local_1b0.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_1b0.pos.row_begin._M_current)->group);
    }
    operator_delete(cVar2._M_current);
  }
  rewind(__stream);
  local_1d0 = (undefined1  [8])0x0;
  local_1c8 = (undefined8 *)((ulong)local_1c8 & 0xffffffff00000000);
  local_1e0.super_Hasher._0_8_ = (long *)0x0;
  local_1e0.super_Hasher.num_compares_ = 0;
  local_1b0.ht = (sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)((ulong)local_1b0.ht & 0xffffffff00000000);
  local_1b0.pos.row_begin._M_current =
       (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
       0x0;
  this_00 = (sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)(local_160 + 8);
  local_160._0_8_ = &PTR__BaseHashtableInterface_00c23ca8;
  pSVar7 = &local_1b1;
  google::
  sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable(this_00,0,(TransparentHasher *)local_1d0,&local_1e0,(Identity *)&local_1c0,
                     pSVar7,(Alloc<int,_unsigned_long,_18446744073709551615UL> *)&local_1b0);
  local_160._0_8_ = &PTR__BaseHashtableInterface_00c23c28;
  local_1d0[0] = (internal)bVar8;
  local_1c8 = (undefined8 *)0x0;
  if (__stream == (FILE *)0x0) {
    testing::Message::Message((Message *)&local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1b0,(internal *)local_1d0,(AssertionResult *)"fp != __null","false",
               "true",(char *)pSVar7);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4db,(char *)local_1b0.ht);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    if (local_1b0.ht !=
        (sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)&local_1b0.pos.row_end) {
      operator_delete(local_1b0.ht);
    }
    if ((long *)local_1e0.super_Hasher._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_1e0.super_Hasher._0_8_ + 8))();
    }
  }
  puVar1 = local_1c8;
  if (local_1c8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1c8 != local_1c8 + 2) {
      operator_delete((undefined8 *)*local_1c8);
    }
    operator_delete(puVar1);
  }
  local_118._0_4_ = 0;
  local_118._4_4_ = 0;
  bVar8 = google::
          sparsetable<int,(unsigned_short)48,Alloc<int,unsigned_long,18446744073709551615ul>>::
          unserialize<google::sparsehash_internal::pod_serializer<int>,_IO_FILE>(local_110,__stream)
  ;
  fVar9 = (float)local_150._24_4_ * (float)local_d8;
  uVar5 = (ulong)fVar9;
  local_150._8_8_ = (long)(fVar9 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
  local_134 = (float)local_d8 * local_134;
  uVar5 = (ulong)local_134;
  local_150._16_8_ = (long)(local_134 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
  local_130 = 0;
  local_1d0[0] = (internal)bVar8;
  local_1c8 = (undefined8 *)0x0;
  if (!bVar8) {
    testing::Message::Message((Message *)&local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1b0,(internal *)local_1d0,
               (AssertionResult *)"ht_in.unserialize(typename TypeParam::NopointerSerializer(), fp)"
               ,"false","true",(char *)pSVar7);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4dc,(char *)local_1b0.ht);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    if (local_1b0.ht !=
        (sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)&local_1b0.pos.row_end) {
      operator_delete(local_1b0.ht);
    }
    if ((long *)local_1e0.super_Hasher._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_1e0.super_Hasher._0_8_ + 8))();
    }
  }
  puVar1 = local_1c8;
  if (local_1c8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1c8 != local_1c8 + 2) {
      operator_delete((undefined8 *)*local_1c8);
    }
    operator_delete(puVar1);
  }
  fclose(__stream);
  iVar4 = UniqueObjectHelper<int>(1);
  local_1e0.super_Hasher.id_ = iVar4;
  local_1c0.data_._0_4_ = UniqueObjectHelper<int>(1);
  google::
  sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>(&local_1b0,this_00,(int *)&local_1c0);
  local_168 = local_160;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1d0,"this->UniqueObject(1)","*ht_in.find(this->UniqueKey(1))",
             (int *)&local_1e0,local_1b0.pos.col_current);
  if (local_1d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1b0);
    if (local_1c8 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*local_1c8;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4df,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e0,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e0);
    if (local_1b0.ht !=
        (sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_1b0.ht)->settings).
                             super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4> +
                  8))();
    }
  }
  puVar1 = local_1c8;
  if (local_1c8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1c8 != local_1c8 + 2) {
      operator_delete((undefined8 *)*local_1c8);
    }
    operator_delete(puVar1);
  }
  iVar4 = UniqueObjectHelper<int>(99);
  local_1e0.super_Hasher.id_ = iVar4;
  local_1c0.data_._0_4_ = UniqueObjectHelper<int>(99);
  google::
  sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>(&local_1b0,this_00,(int *)&local_1c0);
  local_168 = local_160;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1d0,"this->UniqueObject(99)","*ht_in.find(this->UniqueKey(99))",
             (int *)&local_1e0,local_1b0.pos.col_current);
  if (local_1d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1b0);
    if (local_1c8 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*local_1c8;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4e0,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e0,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e0);
    if (local_1b0.ht !=
        (sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_1b0.ht)->settings).
                             super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4> +
                  8))();
    }
  }
  puVar1 = local_1c8;
  if (local_1c8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1c8 != local_1c8 + 2) {
      operator_delete((undefined8 *)*local_1c8);
    }
    operator_delete(puVar1);
  }
  iVar4 = UniqueObjectHelper<int>(100);
  local_1b0.ht = (sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_1b0.ht._4_4_,iVar4);
  pVar10 = google::
           sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(this_00,(int *)&local_1b0);
  bVar8 = pVar10.first == 0xffffffffffffffff;
  local_1d0[0] = (internal)bVar8;
  local_1c8 = (undefined8 *)0x0;
  if (!bVar8) {
    testing::Message::Message((Message *)&local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1b0,(internal *)local_1d0,
               (AssertionResult *)"ht_in.count(this->UniqueKey(100))","true","false",(char *)pSVar7)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4e1,(char *)local_1b0.ht);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    if (local_1b0.ht !=
        (sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)&local_1b0.pos.row_end) {
      operator_delete(local_1b0.ht);
    }
    if ((long *)local_1e0.super_Hasher._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_1e0.super_Hasher._0_8_ + 8))();
    }
  }
  puVar1 = local_1c8;
  if (local_1c8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1c8 != local_1c8 + 2) {
      operator_delete((undefined8 *)*local_1c8);
    }
    operator_delete(puVar1);
  }
  iVar4 = UniqueObjectHelper<int>(0x15);
  local_1e0.super_Hasher.id_ = iVar4;
  local_1c0.data_._0_4_ = UniqueObjectHelper<int>(0x15);
  google::
  sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>(&local_1b0,this_00,(int *)&local_1c0);
  local_168 = local_160;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1d0,"this->UniqueObject(21)","*ht_in.find(this->UniqueKey(21))",
             (int *)&local_1e0,local_1b0.pos.col_current);
  if (local_1d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1b0);
    if (local_1c8 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*local_1c8;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4e2,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e0,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e0);
    if (local_1b0.ht !=
        (sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_1b0.ht)->settings).
                             super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4> +
                  8))();
    }
  }
  puVar1 = local_1c8;
  if (local_1c8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1c8 != local_1c8 + 2) {
      operator_delete((undefined8 *)*local_1c8);
    }
    operator_delete(puVar1);
  }
  iVar4 = UniqueObjectHelper<int>(0x16);
  local_1b0.ht = (sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_1b0.ht._4_4_,iVar4);
  pVar10 = google::
           sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(this_00,(int *)&local_1b0);
  bVar8 = pVar10.first == 0xffffffffffffffff;
  local_1d0[0] = (internal)bVar8;
  local_1c8 = (undefined8 *)0x0;
  if (!bVar8) {
    testing::Message::Message((Message *)&local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1b0,(internal *)local_1d0,
               (AssertionResult *)"ht_in.count(this->UniqueKey(22))","true","false",(char *)pSVar7);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4e4,(char *)local_1b0.ht);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    if (local_1b0.ht !=
        (sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)&local_1b0.pos.row_end) {
      operator_delete(local_1b0.ht);
    }
    if ((long *)local_1e0.super_Hasher._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_1e0.super_Hasher._0_8_ + 8))();
    }
  }
  puVar1 = local_1c8;
  if (local_1c8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1c8 != local_1c8 + 2) {
      operator_delete((undefined8 *)*local_1c8);
    }
    operator_delete(puVar1);
  }
  iVar4 = UniqueObjectHelper<int>(0x38);
  local_1b0.ht = (sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_1b0.ht._4_4_,iVar4);
  pVar10 = google::
           sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::find_position<int>(this_00,(int *)&local_1b0);
  bVar8 = pVar10.first == 0xffffffffffffffff;
  local_1d0[0] = (internal)bVar8;
  local_1c8 = (undefined8 *)0x0;
  if (!bVar8) {
    testing::Message::Message((Message *)&local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_1b0,(internal *)local_1d0,
               (AssertionResult *)"ht_in.count(this->UniqueKey(56))","true","false",(char *)pSVar7);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x4e5,(char *)local_1b0.ht);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    if (local_1b0.ht !=
        (sparse_hashtable<int,_int,_TransparentHasher,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)&local_1b0.pos.row_end) {
      operator_delete(local_1b0.ht);
    }
    if ((long *)local_1e0.super_Hasher._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_1e0.super_Hasher._0_8_ + 8))();
    }
  }
  puVar1 = local_1c8;
  if (local_1c8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1c8 != local_1c8 + 2) {
      operator_delete((undefined8 *)*local_1c8);
    }
    operator_delete(puVar1);
  }
  local_160._0_8_ = &PTR__BaseHashtableInterface_00c23ca8;
  std::
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector((vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
             *)local_110);
  local_c8 = &PTR__BaseHashtableInterface_00c23ca8;
  std::
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector((vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
             *)(local_c0 + 0x48));
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, NopointerSerialization) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  auto fp = tmpfile();
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_out.serialize(typename TypeParam::NopointerSerializer(), fp));
  rewind(fp);

  TypeParam ht_in;
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_in.unserialize(typename TypeParam::NopointerSerializer(), fp));
  fclose(fp);

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}